

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuX11GlxPlatform.cpp
# Opt level: O3

GLXWindow __thiscall tcu::x11::glx::GlxVisual::createWindow(GlxVisual *this,Window xWindow)

{
  GLXWindow GVar1;
  TestError *this_00;
  
  GVar1 = glXCreateWindow((this->m_display->super_XlibDisplay).m_display,this->m_fbConfig,xWindow,0)
  ;
  if (GVar1 != 0) {
    return GVar1;
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  TestError::TestError
            (this_00,"GLX call failed","glXCreateWindow(getXDisplay(), m_fbConfig, xWindow, NULL)",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/platform/X11/tcuX11GlxPlatform.cpp"
             ,0x182);
  __cxa_throw(this_00,&TestError::typeinfo,Exception::~Exception);
}

Assistant:

GLXWindow GlxVisual::createWindow (::Window xWindow)
{
	return TCU_CHECK_GLX(glXCreateWindow(getXDisplay(), m_fbConfig, xWindow, NULL));
}